

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O1

void __thiscall deqp::egl::MakeCurrentPerfCase::createWindow(MakeCurrentPerfCase *this)

{
  pointer *pppNVar1;
  pointer *pppvVar2;
  EglTestContext *pEVar3;
  EGLDisplay pvVar4;
  NativeDisplay *pNVar5;
  EGLConfig pvVar6;
  iterator __position;
  iterator __position_00;
  int iVar7;
  NativeWindowFactory *pNVar8;
  undefined4 extraout_var;
  EGLSurface surface;
  NativeWindow *window;
  void *local_50;
  NativeWindow *local_48;
  undefined8 local_3c;
  Visibility local_34;
  
  EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pNVar8 = eglu::selectNativeWindowFactory
                     (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_48 = (NativeWindow *)0x0;
  local_50 = (void *)0x0;
  pEVar3 = (this->super_TestCase).m_eglTestCtx;
  pvVar4 = this->m_display;
  pNVar5 = (pEVar3->m_nativeDisplay).
           super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
           ptr;
  pvVar6 = this->m_config;
  local_34 = eglu::parseWindowVisibility(pEVar3->m_testCtx->m_cmdLine);
  local_3c = 0x10000000100;
  iVar7 = (*(pNVar8->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar8,pNVar5,pvVar4,pvVar6);
  local_48 = (NativeWindow *)CONCAT44(extraout_var,iVar7);
  local_50 = eglu::createWindowSurface
                       ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                        super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                        .m_data.ptr,local_48,this->m_display,this->m_config,(EGLAttrib *)0x0);
  __position._M_current =
       (this->m_windows).
       super__Vector_base<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_windows).
      super__Vector_base<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<eglu::NativeWindow*,std::allocator<eglu::NativeWindow*>>::
    _M_realloc_insert<eglu::NativeWindow*const&>
              ((vector<eglu::NativeWindow*,std::allocator<eglu::NativeWindow*>> *)&this->m_windows,
               __position,&local_48);
  }
  else {
    *__position._M_current = local_48;
    pppNVar1 = &(this->m_windows).
                super__Vector_base<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  __position_00._M_current =
       (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
              ((vector<void*,std::allocator<void*>> *)&this->m_surfaces,__position_00,&local_50);
  }
  else {
    *__position_00._M_current = local_50;
    pppvVar2 = &(this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar2 = *pppvVar2 + 1;
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::createWindow (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const EGLint						width			= 256;
	const EGLint						height			= 256;

	const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	eglu::NativeWindow*					window			= DE_NULL;
	EGLSurface							surface			= EGL_NO_SURFACE;

	try
	{
		window	= windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_display, m_config, DE_NULL, eglu::WindowParams(width, height, eglu::parseWindowVisibility(m_eglTestCtx.getTestContext().getCommandLine())));
		surface	= eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, m_display, m_config, DE_NULL);
	}
	catch (...)
	{
		if (surface != EGL_NO_SURFACE)
			egl.destroySurface(m_display, surface);

		delete window;
		throw;
	}

	m_windows.push_back(window);
	m_surfaces.push_back(surface);
}